

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knownhost.c
# Opt level: O1

int libssh2_knownhost_readline(LIBSSH2_KNOWNHOSTS *hosts,char *line,size_t len,int type)

{
  int iVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte *pbVar4;
  char *pcVar5;
  byte *host;
  LIBSSH2_SESSION *session;
  size_t sVar6;
  ulong uVar7;
  byte *key;
  size_t sVar8;
  bool bVar9;
  
  if (type == 1) {
    host = (byte *)line;
    sVar6 = len;
    pcVar5 = line;
    if (len != 0) {
      do {
        uVar7 = (ulong)*host;
        if (0x23 < uVar7) {
LAB_00119d8f:
          pbVar2 = host;
          goto LAB_00119d9f;
        }
        if ((0x100000200U >> (uVar7 & 0x3f) & 1) == 0) {
          if ((0x800000401U >> (uVar7 & 0x3f) & 1) != 0) {
            return 0;
          }
          goto LAB_00119d8f;
        }
        sVar6 = sVar6 - 1;
        host = host + 1;
        pcVar5 = pcVar5 + 1;
      } while (sVar6 != 0);
    }
    return 0;
  }
  session = hosts->session;
  pcVar5 = "Unsupported type of known-host information store";
  goto LAB_00119d72;
  while( true ) {
    pbVar2 = pbVar2 + 1;
    sVar6 = sVar6 - 1;
    if (sVar6 == 0) break;
LAB_00119d9f:
    if (((ulong)*pbVar2 < 0x21) && ((0x100000201U >> ((ulong)*pbVar2 & 0x3f) & 1) != 0))
    goto LAB_00119dbf;
  }
  sVar6 = 0;
  pbVar2 = (byte *)(line + len);
LAB_00119dbf:
  bVar9 = sVar6 != 0;
  key = pbVar2;
  if (bVar9) {
    pbVar4 = pbVar2 + sVar6;
    do {
      if ((*key != 0x20) && (*key != 9)) goto LAB_00119df6;
      key = key + 1;
      sVar6 = sVar6 - 1;
      bVar9 = sVar6 != 0;
    } while (bVar9);
    sVar6 = 0;
    key = pbVar4;
  }
LAB_00119df6:
  if ((bVar9) && (*key != 0)) {
    pbVar4 = key;
    if (sVar6 != 0) {
      pbVar3 = key;
      sVar8 = sVar6;
      do {
        pbVar4 = pbVar3;
        if ((*pbVar3 == 0) || (*pbVar3 == 10)) break;
        pbVar3 = pbVar3 + 1;
        sVar8 = sVar8 - 1;
        pbVar4 = key + sVar6;
      } while (sVar8 != 0);
    }
    iVar1 = hostline(hosts,(char *)host,(long)pbVar2 - (long)pcVar5,(char *)key,
                     sVar6 - (*pbVar4 == 10));
    return iVar1;
  }
  session = hosts->session;
  pcVar5 = "Failed to parse known_hosts line";
LAB_00119d72:
  iVar1 = _libssh2_error(session,-0x21,pcVar5);
  return iVar1;
}

Assistant:

LIBSSH2_API int
libssh2_knownhost_readline(LIBSSH2_KNOWNHOSTS *hosts,
                           const char *line, size_t len, int type)
{
    const char *cp;
    const char *hostp;
    const char *keyp;
    size_t hostlen;
    size_t keylen;
    int rc;

    if(type != LIBSSH2_KNOWNHOST_FILE_OPENSSH)
        return _libssh2_error(hosts->session,
                              LIBSSH2_ERROR_METHOD_NOT_SUPPORTED,
                              "Unsupported type of known-host information "
                              "store");

    cp = line;

    /* skip leading whitespaces */
    while(len && ((*cp == ' ') || (*cp == '\t'))) {
        cp++;
        len--;
    }

    if(!len || !*cp || (*cp == '#') || (*cp == '\n'))
        /* comment or empty line */
        return LIBSSH2_ERROR_NONE;

    /* the host part starts here */
    hostp = cp;

    /* move over the host to the separator */
    while(len && *cp && (*cp != ' ') && (*cp != '\t')) {
        cp++;
        len--;
    }

    hostlen = cp - hostp;

    /* the key starts after the whitespaces */
    while(len && *cp && ((*cp == ' ') || (*cp == '\t'))) {
        cp++;
        len--;
    }

    if(!*cp || !len) /* illegal line */
        return _libssh2_error(hosts->session,
                              LIBSSH2_ERROR_METHOD_NOT_SUPPORTED,
                              "Failed to parse known_hosts line");

    keyp = cp; /* the key starts here */
    keylen = len;

    /* check if the line (key) ends with a newline and if so kill it */
    while(len && *cp && (*cp != '\n')) {
        cp++;
        len--;
    }

    /* zero terminate where the newline is */
    if(*cp == '\n')
        keylen--; /* don't include this in the count */

    /* deal with this one host+key line */
    rc = hostline(hosts, hostp, hostlen, keyp, keylen);
    if(rc)
        return rc; /* failed */

    return LIBSSH2_ERROR_NONE; /* success */
}